

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall sfc::Image::set_default_palette(Image *this,uint indices)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->_palette,(ulong)indices);
  puVar1 = (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  uVar4 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  do {
    puVar1[uVar4] =
         ((int)uVar4 * SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar2,0) & 0xffU) * 0x10101 |
         0xff000000;
    uVar4 = uVar4 + 1;
  } while ((uVar4 & 0xffffffff) < uVar3);
  return;
}

Assistant:

void Image::set_default_palette(const unsigned indices) {
  _palette.resize(indices);
  channel_t add = 0x100 / _palette.size();
  for (unsigned i = 0; i < _palette.size(); ++i) {
    channel_t value = add * i;
    _palette[i] = (rgba_t)(0xff000000 + value + (value << 8) + (value << 16));
  }
}